

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var Js::JavascriptArray::EntryShift(RecyclableObject *function,CallInfo callInfo,...)

{
  Type TVar1;
  code *pcVar2;
  PCWSTR pWVar3;
  int32 nValue;
  undefined8 scriptContext_00;
  bool bVar4;
  int iVar5;
  CallFlags e;
  BOOL BVar6;
  uint32 uVar7;
  ScriptContext *pSVar8;
  ThreadContext *pTVar9;
  Var *values;
  undefined4 *puVar10;
  Var pvVar11;
  JavascriptLibrary *pJVar12;
  JavascriptArray *pJVar13;
  Recycler *recycler_00;
  SparseArraySegmentBase *pSVar14;
  SparseArraySegmentBase **ppSVar15;
  SparseArraySegment<int> *pSVar16;
  SparseArraySegment<double> *pSVar17;
  SparseArraySegment<void_*> *pSVar18;
  uint64 uVar19;
  uint32 local_37c;
  byte local_1a2;
  Var element_1;
  undefined1 local_150 [4];
  BOOL hasItem_1;
  uint64 local_140;
  uint64 i_1;
  Var element;
  BOOL hasItem;
  uint32 i;
  uint32 lengthToUin32Max;
  BOOL gotItem;
  undefined1 local_110 [8];
  BigIndex length_1;
  ThrowTypeErrorOnFailureHelper h;
  RecyclableObject *dynamicObject;
  double nativeResult_1;
  undefined1 local_d8 [4];
  int32 nativeResult;
  AutoDisableInterrupt failFastOnError;
  bool isFloatArray;
  bool isIntArray;
  Recycler *recycler;
  uint32 length;
  JavascriptArray *pArr;
  bool useNoSideEffectShift;
  CallInfo CStack_a0;
  Var res;
  undefined1 local_88 [8];
  JsReentLock jsReentLock;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  CallInfo local_10;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar8 = RecyclableObject::GetScriptContext(function);
  pTVar9 = ScriptContext::GetThreadContext(pSVar8);
  pSVar8 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(pTVar9,0xc00,pSVar8,(PVOID)0x0);
  iVar5 = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,iVar5);
  args.super_Arguments.Values = (Type)function_local;
  bVar4 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x1765,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  jsReentLock._24_8_ = RecyclableObject::GetScriptContext(function);
  pTVar9 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
  JsReentLock::JsReentLock((JsReentLock *)local_88,pTVar9);
  pvVar11 = Arguments::operator[]((Arguments *)&scriptContext,0);
  JsReentLock::setObjectForMutation((JsReentLock *)local_88,pvVar11);
  e = Js::operator&((uint)function_local._3_1_,CallFlags_New);
  bVar4 = operator!(e);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x176a,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  pJVar12 = ScriptContext::GetLibrary((ScriptContext *)jsReentLock._24_8_);
  CStack_a0 = (CallInfo)JavascriptLibraryBase::GetUndefined(&pJVar12->super_JavascriptLibraryBase);
  callInfo_local = CStack_a0;
  if (((ulong)scriptContext & 0xffffff) != 0) {
    pvVar11 = Arguments::operator[]((Arguments *)&scriptContext,0);
    bVar4 = IsNonES5Array(pvVar11);
    local_1a2 = 0;
    if (bVar4) {
      pvVar11 = Arguments::operator[]((Arguments *)&scriptContext,0);
      pJVar13 = VarTo<Js::JavascriptArray>(pvVar11);
      iVar5 = (*(pJVar13->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x66])();
      local_1a2 = 0;
      if (iVar5 == 0) {
        pvVar11 = Arguments::operator[]((Arguments *)&scriptContext,0);
        pJVar13 = UnsafeVarTo<Js::JavascriptArray>(pvVar11);
        bVar4 = HasAnyES5ArrayInPrototypeChain(pJVar13,false);
        local_1a2 = bVar4 ^ 0xff;
      }
    }
    if ((local_1a2 & 1) == 0) {
      h.m_functionName = (PCWSTR)0x0;
      pvVar11 = Arguments::operator[]((Arguments *)&scriptContext,0);
      BVar6 = JavascriptConversion::ToObject
                        (pvVar11,(ScriptContext *)jsReentLock._24_8_,
                         (RecyclableObject **)&h.m_functionName);
      if (BVar6 == 0) {
        JavascriptError::ThrowTypeError
                  ((ScriptContext *)jsReentLock._24_8_,-0x7ff5ec42,L"Array.prototype.shift");
      }
      ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailureHelper
                ((ThrowTypeErrorOnFailureHelper *)&length_1.bigIndex,
                 (ScriptContext *)jsReentLock._24_8_,L"Array.prototype.shift");
      JsReentLock::unlock((JsReentLock *)local_88);
      uVar19 = OP_GetLength(h.m_functionName,(ScriptContext *)jsReentLock._24_8_);
      BigIndex::BigIndex((BigIndex *)local_110,uVar19);
      JsReentLock::MutateArrayObject((JsReentLock *)local_88);
      JsReentLock::relock((JsReentLock *)local_88);
      BigIndex::BigIndex((BigIndex *)&lengthToUin32Max,0);
      bVar4 = BigIndex::operator==((BigIndex *)local_110,(BigIndex *)&lengthToUin32Max);
      if (bVar4) {
        JsReentLock::unlock((JsReentLock *)local_88);
        pWVar3 = h.m_functionName;
        pvVar11 = TaggedInt::ToVarUnchecked(0);
        BVar6 = Js::JavascriptOperators::SetProperty
                          (pWVar3,(RecyclableObject *)pWVar3,0xd1,pvVar11,
                           (ScriptContext *)jsReentLock._24_8_,
                           PropertyOperation_ThrowIfNotExtensible);
        ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                  ((ThrowTypeErrorOnFailureHelper *)&length_1.bigIndex,BVar6);
        JsReentLock::MutateArrayObject((JsReentLock *)local_88);
        JsReentLock::relock((JsReentLock *)local_88);
        pJVar12 = ScriptContext::GetLibrary((ScriptContext *)jsReentLock._24_8_);
        callInfo_local =
             (CallInfo)JavascriptLibraryBase::GetUndefined(&pJVar12->super_JavascriptLibraryBase);
        goto LAB_010d3b6d;
      }
      JsReentLock::unlock((JsReentLock *)local_88);
      i = Js::JavascriptOperators::GetItem
                    ((RecyclableObject *)h.m_functionName,0,(Var *)&stack0xffffffffffffff60,
                     (ScriptContext *)jsReentLock._24_8_);
      JsReentLock::MutateArrayObject((JsReentLock *)local_88);
      JsReentLock::relock((JsReentLock *)local_88);
      if (i == 0) {
        pJVar12 = ScriptContext::GetLibrary((ScriptContext *)jsReentLock._24_8_);
        CStack_a0 = (CallInfo)
                    JavascriptLibraryBase::GetUndefined(&pJVar12->super_JavascriptLibraryBase);
      }
      BigIndex::operator--((BigIndex *)local_110);
      bVar4 = BigIndex::IsSmallIndex((BigIndex *)local_110);
      if (bVar4) {
        local_37c = BigIndex::GetSmallIndex((BigIndex *)local_110);
      }
      else {
        local_37c = 0xffffffff;
      }
      hasItem = local_37c;
      for (element._4_4_ = 0; element._4_4_ < (uint)hasItem; element._4_4_ = element._4_4_ + 1) {
        JsReentLock::unlock((JsReentLock *)local_88);
        element._0_4_ =
             Js::JavascriptOperators::HasItem
                       ((RecyclableObject *)h.m_functionName,element._4_4_ + 1);
        JsReentLock::MutateArrayObject((JsReentLock *)local_88);
        JsReentLock::relock((JsReentLock *)local_88);
        if ((BOOL)element == 0) {
          JsReentLock::unlock((JsReentLock *)local_88);
          BVar6 = Js::JavascriptOperators::DeleteItem
                            ((RecyclableObject *)h.m_functionName,element._4_4_,
                             PropertyOperation_ThrowOnDeleteIfNotConfig);
          ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                    ((ThrowTypeErrorOnFailureHelper *)&length_1.bigIndex,BVar6);
          JsReentLock::MutateArrayObject((JsReentLock *)local_88);
          JsReentLock::relock((JsReentLock *)local_88);
        }
        else {
          i_1 = 0;
          JsReentLock::unlock((JsReentLock *)local_88);
          i_1 = (uint64)Js::JavascriptOperators::GetItem
                                  ((RecyclableObject *)h.m_functionName,element._4_4_ + 1,
                                   (ScriptContext *)jsReentLock._24_8_);
          BVar6 = Js::JavascriptOperators::SetItem
                            (h.m_functionName,(RecyclableObject *)h.m_functionName,element._4_4_,
                             (Var)i_1,(ScriptContext *)jsReentLock._24_8_,
                             PropertyOperation_ThrowIfNotExtensible,1);
          ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                    ((ThrowTypeErrorOnFailureHelper *)&length_1.bigIndex,BVar6);
          JsReentLock::MutateArrayObject((JsReentLock *)local_88);
          JsReentLock::relock((JsReentLock *)local_88);
        }
      }
      local_140 = 0xffffffff;
      while( true ) {
        BigIndex::BigIndex((BigIndex *)local_150,local_140);
        bVar4 = BigIndex::operator>((BigIndex *)local_110,(BigIndex *)local_150);
        if (!bVar4) break;
        JsReentLock::unlock((JsReentLock *)local_88);
        BVar6 = Js::JavascriptOperators::HasItem((RecyclableObject *)h.m_functionName,local_140 + 1)
        ;
        JsReentLock::MutateArrayObject((JsReentLock *)local_88);
        JsReentLock::relock((JsReentLock *)local_88);
        if (BVar6 == 0) {
          JsReentLock::unlock((JsReentLock *)local_88);
          BVar6 = Js::JavascriptOperators::DeleteItem
                            ((RecyclableObject *)h.m_functionName,local_140,
                             PropertyOperation_ThrowOnDeleteIfNotConfig);
          ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                    ((ThrowTypeErrorOnFailureHelper *)&length_1.bigIndex,BVar6);
          JsReentLock::MutateArrayObject((JsReentLock *)local_88);
          JsReentLock::relock((JsReentLock *)local_88);
        }
        else {
          JsReentLock::unlock((JsReentLock *)local_88);
          pvVar11 = Js::JavascriptOperators::GetItem
                              ((RecyclableObject *)h.m_functionName,local_140 + 1,
                               (ScriptContext *)jsReentLock._24_8_);
          BVar6 = Js::JavascriptOperators::SetItem
                            (h.m_functionName,(RecyclableObject *)h.m_functionName,local_140,pvVar11
                             ,(ScriptContext *)jsReentLock._24_8_,
                             PropertyOperation_ThrowIfNotExtensible);
          ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                    ((ThrowTypeErrorOnFailureHelper *)&length_1.bigIndex,BVar6);
          JsReentLock::MutateArrayObject((JsReentLock *)local_88);
          JsReentLock::relock((JsReentLock *)local_88);
        }
        local_140 = local_140 + 1;
      }
      bVar4 = BigIndex::IsSmallIndex((BigIndex *)local_110);
      if (bVar4) {
        JsReentLock::unlock((JsReentLock *)local_88);
        pWVar3 = h.m_functionName;
        uVar7 = BigIndex::GetSmallIndex((BigIndex *)local_110);
        BVar6 = Js::JavascriptOperators::DeleteItem
                          ((RecyclableObject *)pWVar3,uVar7,
                           PropertyOperation_ThrowOnDeleteIfNotConfig);
        ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                  ((ThrowTypeErrorOnFailureHelper *)&length_1.bigIndex,BVar6);
        pWVar3 = h.m_functionName;
        uVar7 = BigIndex::GetSmallIndex((BigIndex *)local_110);
        pvVar11 = JavascriptNumber::ToVar(uVar7,(ScriptContext *)jsReentLock._24_8_);
        BVar6 = Js::JavascriptOperators::SetProperty
                          (pWVar3,(RecyclableObject *)pWVar3,0xd1,pvVar11,
                           (ScriptContext *)jsReentLock._24_8_,
                           PropertyOperation_ThrowIfNotExtensible);
        ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                  ((ThrowTypeErrorOnFailureHelper *)&length_1.bigIndex,BVar6);
        JsReentLock::MutateArrayObject((JsReentLock *)local_88);
        JsReentLock::relock((JsReentLock *)local_88);
      }
      else {
        JsReentLock::unlock((JsReentLock *)local_88);
        pWVar3 = h.m_functionName;
        uVar19 = BigIndex::GetBigIndex((BigIndex *)local_110);
        BVar6 = Js::JavascriptOperators::DeleteItem
                          ((RecyclableObject *)pWVar3,uVar19,
                           PropertyOperation_ThrowOnDeleteIfNotConfig);
        ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                  ((ThrowTypeErrorOnFailureHelper *)&length_1.bigIndex,BVar6);
        pWVar3 = h.m_functionName;
        uVar19 = BigIndex::GetBigIndex((BigIndex *)local_110);
        pvVar11 = JavascriptNumber::ToVar(uVar19,(ScriptContext *)jsReentLock._24_8_);
        BVar6 = Js::JavascriptOperators::SetProperty
                          (pWVar3,(RecyclableObject *)pWVar3,0xd1,pvVar11,
                           (ScriptContext *)jsReentLock._24_8_,
                           PropertyOperation_ThrowIfNotExtensible);
        ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                  ((ThrowTypeErrorOnFailureHelper *)&length_1.bigIndex,BVar6);
        JsReentLock::MutateArrayObject((JsReentLock *)local_88);
        JsReentLock::relock((JsReentLock *)local_88);
      }
    }
    else {
      pvVar11 = Arguments::operator[]((Arguments *)&scriptContext,0);
      pJVar13 = UnsafeVarTo<Js::JavascriptArray>(pvVar11);
      if ((pJVar13->super_ArrayObject).length == 0) {
        callInfo_local = CStack_a0;
        goto LAB_010d3b6d;
      }
      TVar1 = (pJVar13->super_ArrayObject).length;
      bVar4 = IsFillFromPrototypes(pJVar13);
      if (bVar4) {
        FillFromPrototypes(pJVar13,0,(pJVar13->super_ArrayObject).length);
      }
      if (TVar1 != (pJVar13->super_ArrayObject).length) {
        Throw::FatalInternalError(-0x7fffbffb);
      }
      bVar4 = HasNoMissingValues(pJVar13);
      if ((bVar4) &&
         (ppSVar15 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                               ((WriteBarrierPtr *)&pJVar13->head),
         *ppSVar15 != (SparseArraySegmentBase *)0x0)) {
        pSVar14 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->(&pJVar13->head);
        ppSVar15 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                             ((WriteBarrierPtr *)&pSVar14->next);
        if (*ppSVar15 != (SparseArraySegmentBase *)0x0) {
          SetHasNoMissingValues(pJVar13,false);
        }
      }
      (pJVar13->super_ArrayObject).length = (pJVar13->super_ArrayObject).length - 1;
      ClearSegmentMap(pJVar13);
      recycler_00 = ScriptContext::GetRecycler((ScriptContext *)jsReentLock._24_8_);
      failFastOnError._15_1_ = 0;
      failFastOnError._14_1_ = 0;
      bVar4 = VarIs<Js::JavascriptNativeIntArray,Js::JavascriptArray>(pJVar13);
      if (bVar4) {
        failFastOnError._15_1_ = 1;
      }
      else {
        bVar4 = VarIs<Js::JavascriptNativeFloatArray,Js::JavascriptArray>(pJVar13);
        if (bVar4) {
          failFastOnError._14_1_ = 1;
        }
      }
      pTVar9 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
      AutoDisableInterrupt::AutoDisableInterrupt((AutoDisableInterrupt *)local_d8,pTVar9,true);
      pSVar14 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->(&pJVar13->head);
      if (pSVar14->length != 0) {
        if ((failFastOnError._15_1_ & 1) == 0) {
          if ((failFastOnError._14_1_ & 1) == 0) {
            ppSVar15 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                                 ((WriteBarrierPtr *)&pJVar13->head);
            pSVar18 = SparseArraySegment<void_*>::From(*ppSVar15);
            CStack_a0 = (CallInfo)SparseArraySegment<void_*>::GetElement(pSVar18,0);
            bVar4 = SparseArraySegment<void_*>::IsMissingItem((void **)&stack0xffffffffffffff60);
            if (bVar4) {
              pJVar12 = ScriptContext::GetLibrary((ScriptContext *)jsReentLock._24_8_);
              CStack_a0 = (CallInfo)
                          JavascriptLibraryBase::GetUndefined(&pJVar12->super_JavascriptLibraryBase)
              ;
            }
            else {
              CStack_a0 = (CallInfo)
                          CrossSite::MarshalVar
                                    ((ScriptContext *)jsReentLock._24_8_,(Var)CStack_a0,false);
            }
            ppSVar15 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                                 ((WriteBarrierPtr *)&pJVar13->head);
            pSVar18 = SparseArraySegment<void_*>::From(*ppSVar15);
            SparseArraySegment<void_*>::RemoveElement(pSVar18,recycler_00,0);
          }
          else {
            ppSVar15 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                                 ((WriteBarrierPtr *)&pJVar13->head);
            pSVar17 = SparseArraySegment<double>::From(*ppSVar15);
            dynamicObject = (RecyclableObject *)SparseArraySegment<double>::GetElement(pSVar17,0);
            bVar4 = SparseArraySegment<double>::IsMissingItem((double *)&dynamicObject);
            if (bVar4) {
              pJVar12 = ScriptContext::GetLibrary((ScriptContext *)jsReentLock._24_8_);
              CStack_a0 = (CallInfo)
                          JavascriptLibraryBase::GetUndefined(&pJVar12->super_JavascriptLibraryBase)
              ;
            }
            else {
              CStack_a0 = (CallInfo)
                          JavascriptNumber::ToVarNoCheck
                                    ((double)dynamicObject,(ScriptContext *)jsReentLock._24_8_);
            }
            ppSVar15 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                                 ((WriteBarrierPtr *)&pJVar13->head);
            pSVar17 = SparseArraySegment<double>::From(*ppSVar15);
            SparseArraySegment<double>::RemoveElement(pSVar17,recycler_00,0);
          }
        }
        else {
          ppSVar15 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                               ((WriteBarrierPtr *)&pJVar13->head);
          pSVar16 = SparseArraySegment<int>::From(*ppSVar15);
          nativeResult_1._4_4_ = SparseArraySegment<int>::GetElement(pSVar16,0);
          bVar4 = SparseArraySegment<int>::IsMissingItem((int *)((long)&nativeResult_1 + 4));
          scriptContext_00 = jsReentLock._24_8_;
          nValue = nativeResult_1._4_4_;
          if (bVar4) {
            pJVar12 = ScriptContext::GetLibrary((ScriptContext *)jsReentLock._24_8_);
            CStack_a0 = (CallInfo)
                        JavascriptLibraryBase::GetUndefined(&pJVar12->super_JavascriptLibraryBase);
          }
          else {
            bVar4 = TaggedInt::IsOverflow(nativeResult_1._4_4_);
            if (bVar4) {
              local_10 = (CallInfo)
                         JavascriptNumber::NewInlined
                                   ((double)nValue,(ScriptContext *)scriptContext_00);
            }
            else {
              local_10 = (CallInfo)TaggedInt::ToVarUnchecked(nValue);
            }
            CStack_a0 = local_10;
          }
          ppSVar15 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                               ((WriteBarrierPtr *)&pJVar13->head);
          pSVar16 = SparseArraySegment<int>::From(*ppSVar15);
          SparseArraySegment<int>::RemoveElement(pSVar16,recycler_00,0);
        }
      }
      if ((failFastOnError._15_1_ & 1) == 0) {
        if ((failFastOnError._14_1_ & 1) == 0) {
          ShiftHelper<void*>(pJVar13,(ScriptContext *)jsReentLock._24_8_);
        }
        else {
          ShiftHelper<double>(pJVar13,(ScriptContext *)jsReentLock._24_8_);
        }
      }
      else {
        ShiftHelper<int>(pJVar13,(ScriptContext *)jsReentLock._24_8_);
      }
      AutoDisableInterrupt::Completed((AutoDisableInterrupt *)local_d8);
      AutoDisableInterrupt::~AutoDisableInterrupt((AutoDisableInterrupt *)local_d8);
    }
    callInfo_local = CStack_a0;
  }
LAB_010d3b6d:
  JsReentLock::~JsReentLock((JsReentLock *)local_88);
  return (Var)callInfo_local;
}

Assistant:

Var JavascriptArray::EntryShift(RecyclableObject* function, CallInfo callInfo, ...)
    {
        JIT_HELPER_REENTRANT_HEADER(Array_Shift);
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, args[0]);

        Assert(!(callInfo.Flags & CallFlags_New));

        Var res = scriptContext->GetLibrary()->GetUndefined();

        if (args.Info.Count == 0)
        {
            return res;
        }

        bool useNoSideEffectShift = JavascriptArray::IsNonES5Array(args[0])
            && !VarTo<JavascriptArray>(args[0])->IsCrossSiteObject()
            && !HasAnyES5ArrayInPrototypeChain(UnsafeVarTo<JavascriptArray>(args[0]));

        if (useNoSideEffectShift)
        {
            JavascriptArray * pArr = UnsafeVarTo<JavascriptArray>(args[0]);

            if (pArr->length == 0)
            {
                return res;
            }

            uint32 length = pArr->length;

            if(pArr->IsFillFromPrototypes())
            {
                pArr->FillFromPrototypes(0, pArr->length); // We need find all missing value from [[proto]] object
            }

            // As we have already established that the FillFromPrototype should not change the bound of the array.
            if (length != pArr->length)
            {
                Js::Throw::FatalInternalError();
            }

            if(pArr->HasNoMissingValues() && pArr->head && pArr->head->next)
            {
                // This function currently does not track missing values in the head segment if there are multiple segments
                pArr->SetHasNoMissingValues(false);
            }

            pArr->length--;

            pArr->ClearSegmentMap(); // Dump segmentMap on shift (before any allocation)

            Recycler * recycler = scriptContext->GetRecycler();

            bool isIntArray = false;
            bool isFloatArray = false;

            if(VarIs<JavascriptNativeIntArray>(pArr))
            {
                isIntArray = true;
            }
            else if(VarIs<JavascriptNativeFloatArray>(pArr))
            {
                isFloatArray = true;
            }

            // Code below has potential to throw due to OOM or SO. Just FailFast on those cases
            AutoDisableInterrupt failFastOnError(scriptContext->GetThreadContext());

            if (pArr->head->length != 0)
            {
                if(isIntArray)
                {
                    int32 nativeResult = SparseArraySegment<int32>::From(pArr->head)->GetElement(0);

                    if(SparseArraySegment<int32>::IsMissingItem(&nativeResult))
                    {
                        res = scriptContext->GetLibrary()->GetUndefined();
                    }
                    else
                    {
                        res = Js::JavascriptNumber::ToVar(nativeResult, scriptContext);
                    }
                    SparseArraySegment<int32>::From(pArr->head)->RemoveElement(recycler, 0);
                }
                else if (isFloatArray)
                {
                    double nativeResult = SparseArraySegment<double>::From(pArr->head)->GetElement(0);

                    if(SparseArraySegment<double>::IsMissingItem(&nativeResult))
                    {
                        res = scriptContext->GetLibrary()->GetUndefined();
                    }
                    else
                    {
                        res = Js::JavascriptNumber::ToVarNoCheck(nativeResult, scriptContext);
                    }
                    SparseArraySegment<double>::From(pArr->head)->RemoveElement(recycler, 0);
                }
                else
                {
                    res = SparseArraySegment<Var>::From(pArr->head)->GetElement(0);

                    if(SparseArraySegment<Var>::IsMissingItem(&res))
                    {
                        res = scriptContext->GetLibrary()->GetUndefined();
                    }
                    else
                    {
                        res = CrossSite::MarshalVar(scriptContext, res);
                    }
                    SparseArraySegment<Var>::From(pArr->head)->RemoveElement(recycler, 0);
                }
            }

            if(isIntArray)
            {
                ShiftHelper<int32>(pArr, scriptContext);
            }
            else if (isFloatArray)
            {
                ShiftHelper<double>(pArr, scriptContext);
            }
            else
            {
                ShiftHelper<Var>(pArr, scriptContext);
            }
            failFastOnError.Completed();

        }
        else
        {
            RecyclableObject* dynamicObject = nullptr;
            if (FALSE == JavascriptConversion::ToObject(args[0], scriptContext, &dynamicObject))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, _u("Array.prototype.shift"));
            }

            ThrowTypeErrorOnFailureHelper h(scriptContext, _u("Array.prototype.shift"));

            JS_REENTRANT(jsReentLock, BigIndex length = OP_GetLength(dynamicObject, scriptContext));

            if (length == 0u)
            {
                // If length is 0, return 'undefined'
                JS_REENTRANT(jsReentLock,
                    h.ThrowTypeErrorOnFailure(JavascriptOperators::SetProperty(dynamicObject, dynamicObject, PropertyIds::length, TaggedInt::ToVarUnchecked(0), scriptContext, PropertyOperation_ThrowIfNotExtensible)));
                return scriptContext->GetLibrary()->GetUndefined();
            }

            JS_REENTRANT(jsReentLock,
                BOOL gotItem = JavascriptOperators::GetItem(dynamicObject, 0u, &res, scriptContext));
            if (!gotItem)
            {
                res = scriptContext->GetLibrary()->GetUndefined();
            }
            --length;
            uint32 lengthToUin32Max = length.IsSmallIndex() ? length.GetSmallIndex() : MaxArrayLength;
            for (uint32 i = 0u; i < lengthToUin32Max; i++)
            {
                JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(dynamicObject, i + 1));
                if (hasItem)
                {
                    Var element = nullptr;
                    JS_REENTRANT(jsReentLock,
                        element = JavascriptOperators::GetItem(dynamicObject, i + 1, scriptContext),
                        h.ThrowTypeErrorOnFailure(JavascriptOperators::SetItem(dynamicObject, dynamicObject, i, element, scriptContext, PropertyOperation_ThrowIfNotExtensible, /*skipPrototypeCheck*/ true)));
                }
                else
                {
                    JS_REENTRANT(jsReentLock, h.ThrowTypeErrorOnFailure(JavascriptOperators::DeleteItem(dynamicObject, i, PropertyOperation_ThrowOnDeleteIfNotConfig)));
                }
            }

            for (uint64 i = MaxArrayLength; length > i; i++)
            {
                JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(dynamicObject, i + 1));
                if (hasItem)
                {
                    Var element = nullptr;
                    JS_REENTRANT(jsReentLock,
                        element = JavascriptOperators::GetItem(dynamicObject, i + 1, scriptContext),
                        h.ThrowTypeErrorOnFailure(JavascriptOperators::SetItem(dynamicObject, dynamicObject, i, element, scriptContext, PropertyOperation_ThrowIfNotExtensible)));
                }
                else
                {
                    JS_REENTRANT(jsReentLock, h.ThrowTypeErrorOnFailure(JavascriptOperators::DeleteItem(dynamicObject, i, PropertyOperation_ThrowOnDeleteIfNotConfig)));
                }
            }

            if (length.IsSmallIndex())
            {
                JS_REENTRANT(jsReentLock,
                    h.ThrowTypeErrorOnFailure(JavascriptOperators::DeleteItem(dynamicObject, length.GetSmallIndex(), PropertyOperation_ThrowOnDeleteIfNotConfig)),
                    h.ThrowTypeErrorOnFailure(JavascriptOperators::SetProperty(dynamicObject, dynamicObject, PropertyIds::length, JavascriptNumber::ToVar(length.GetSmallIndex(), scriptContext), scriptContext, PropertyOperation_ThrowIfNotExtensible)));
            }
            else
            {
                JS_REENTRANT(jsReentLock,
                    h.ThrowTypeErrorOnFailure(JavascriptOperators::DeleteItem(dynamicObject, length.GetBigIndex(), PropertyOperation_ThrowOnDeleteIfNotConfig)),
                    h.ThrowTypeErrorOnFailure(JavascriptOperators::SetProperty(dynamicObject, dynamicObject, PropertyIds::length, JavascriptNumber::ToVar(length.GetBigIndex(), scriptContext), scriptContext, PropertyOperation_ThrowIfNotExtensible)));
            }
        }
        return res;
        JIT_HELPER_END(Array_Shift);
    }